

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O3

ostream * operator<<(ostream *out,value_t t)

{
  long lVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  switch(CONCAT71(in_register_00000031,t) & 0xffffffff) {
  case 0:
    pcVar2 = "null";
    lVar1 = 4;
    break;
  case 1:
    pcVar2 = "object";
    goto LAB_0013785b;
  case 2:
    pcVar2 = "array";
    lVar1 = 5;
    break;
  case 3:
    pcVar2 = "string";
LAB_0013785b:
    lVar1 = 6;
    break;
  case 4:
    pcVar2 = "boolean";
    lVar1 = 7;
    break;
  case 5:
    pcVar2 = "number_integer";
    lVar1 = 0xe;
    break;
  case 6:
    pcVar2 = "number_unsigned";
    lVar1 = 0xf;
    break;
  case 7:
    pcVar2 = "number_float";
    lVar1 = 0xc;
    break;
  case 8:
    pcVar2 = "discarded";
    lVar1 = 9;
    break;
  default:
    goto switchD_00137811_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
switchD_00137811_default:
  return out;
}

Assistant:

std::ostream& operator<< (std::ostream& out, Json::value_t t) {
	switch (t) {
		case Json::value_t::null: out << "null"; break;
		case Json::value_t::object: out << "object"; break;
		case Json::value_t::array: out << "array"; break;
		case Json::value_t::string: out << "string"; break;
		case Json::value_t::boolean: out << "boolean"; break;
		case Json::value_t::number_integer: out << "number_integer"; break;
		case Json::value_t::number_unsigned: out << "number_unsigned"; break;
		case Json::value_t::number_float: out << "number_float"; break;
		case Json::value_t::discarded: out << "discarded"; break;
	}
	return out;
}